

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

bool __thiscall wallet::WalletInit::ParameterInteraction(WalletInit *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar1;
  string *wallet;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_allocated_capacity = (size_type)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-disablewallet","");
  bVar1 = ArgsManager::GetBoolArg(&gArgs,(string *)&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  if (bVar1) {
    local_50._M_allocated_capacity = (size_type)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-wallet","");
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,&gArgs,(string *)&local_50);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_;
    }
    for (; args_1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._8_8_; args_1 = args_1 + 1) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "ParameterInteraction";
      logging_function._M_len = 0x14;
      LogPrintFormatInternal<char[21],std::__cxx11::string>
                (logging_function,source_file,0x70,ALL,Info,(ConstevalFormatString<2U>)0x814259,
                 (char (*) [21])0x7ceb6b,args_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
  }
  else {
    local_50._M_allocated_capacity = (size_type)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-blocksonly","");
    bVar1 = ArgsManager::GetBoolArg(&gArgs,(string *)&local_50,false);
    if (bVar1) {
      local_70._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"-walletbroadcast","");
      bVar1 = ArgsManager::SoftSetBoolArg(&gArgs,(string *)local_70,false);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
      }
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
    }
    if (bVar1 != false) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
      ;
      source_file_00._M_len = 0x5f;
      logging_function_00._M_str = "ParameterInteraction";
      logging_function_00._M_len = 0x14;
      LogPrintFormatInternal<char[21]>
                (logging_function_00,source_file_00,0x77,ALL,Info,
                 (ConstevalFormatString<1U>)0x81429b,(char (*) [21])0x7ceb6b);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool WalletInit::ParameterInteraction() const
{
#ifdef USE_BDB
     if (!BerkeleyDatabaseSanityCheck()) {
         return InitError(Untranslated("A version conflict was detected between the run-time BerkeleyDB library and the one used during compilation."));
     }
#endif
    if (gArgs.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        for (const std::string& wallet : gArgs.GetArgs("-wallet")) {
            LogPrintf("%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n", __func__, wallet);
        }

        return true;
    }

    if (gArgs.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY) && gArgs.SoftSetBoolArg("-walletbroadcast", false)) {
        LogPrintf("%s: parameter interaction: -blocksonly=1 -> setting -walletbroadcast=0\n", __func__);
    }

    return true;
}